

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O1

bool picojson::
     _parse_object<picojson::default_parse_context,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               (default_parse_context *ctx,
               input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *in)

{
  bool bVar1;
  bool bVar2;
  string key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar1 = default_parse_context::parse_object_start(ctx);
  if (bVar1) {
    bVar1 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::expect(in,0x7d);
    bVar2 = true;
    if (!bVar1) {
      do {
        local_48._M_string_length = 0;
        local_48.field_2._M_local_buf[0] = '\0';
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        bVar1 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::expect(in,0x22);
        if (bVar1) {
          bVar1 = _parse_string<std::__cxx11::string,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                            (&local_48,in);
          if (!bVar1) goto LAB_0010bc33;
          bVar1 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::expect(in,0x3a);
          if (!bVar1) goto LAB_0010bc33;
          bVar1 = default_parse_context::
                  parse_object_item<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                            (ctx,in,&local_48);
        }
        else {
LAB_0010bc33:
          bVar1 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,
                          CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                                   local_48.field_2._M_local_buf[0]) + 1);
        }
        if (bVar1 == false) goto LAB_0010bc74;
        bVar1 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::expect(in,0x2c);
      } while (bVar1);
      bVar2 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::expect(in,0x7d);
    }
  }
  else {
LAB_0010bc74:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

inline bool _parse_object(Context &ctx, input<Iter> &in) {
  if (!ctx.parse_object_start()) {
    return false;
  }
  if (in.expect('}')) {
    return true;
  }
  do {
    std::string key;
    if (!in.expect('"') || !_parse_string(key, in) || !in.expect(':')) {
      return false;
    }
    if (!ctx.parse_object_item(in, key)) {
      return false;
    }
  } while (in.expect(','));
  return in.expect('}');
}